

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::load(Executor *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined1 local_30 [8];
  Values initial;
  uint numberOfUnits;
  Executor *this_local;
  
  std::operator<<((ostream *)&std::cout,"Insert number of units:\n> ");
  std::istream::operator>>
            ((istream *)&std::cin,
             (uint *)((long)&initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  if (initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    loadSizes(this,initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
    loadDesired(this,initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_);
    loadInitial((Values *)local_30,this,
                initial.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,(Values *)local_30);
    execute(this,&local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  }
  return;
}

Assistant:

void Executor::load()
{
    unsigned int numberOfUnits;

    std::cout << "Insert number of units:\n> ";
    std::cin >> numberOfUnits;

    if (numberOfUnits <= 0)
        return;

    // Load states and sizes

    loadSizes(numberOfUnits);
    loadDesired(numberOfUnits);
    Values initial = loadInitial(numberOfUnits);

    execute(std::move(initial));
}